

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O2

void __thiscall QLabelPrivate::ensureTextPopulated(QLabelPrivate *this)

{
  long lVar1;
  undefined1 *puVar2;
  char cVar3;
  bool bVar4;
  ushort uVar5;
  QTextDocument *pQVar6;
  bool bVar7;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  undefined4 local_74;
  QLatin1StringView local_68;
  QArrayDataPointer<char16_t> local_58;
  QTextCursor cursor;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = *(ushort *)&this->field_0x340;
  if ((uVar5 & 8) != 0) {
    if ((QWidgetTextControl *)this->control != (QWidgetTextControl *)0x0) {
      pQVar6 = QWidgetTextControl::document((QWidgetTextControl *)this->control);
      uVar5 = *(ushort *)&this->field_0x340;
      if ((uVar5 & 8) != 0) {
        if (this->effectiveTextFormat == MarkdownText) {
          QTextDocument::setMarkdown(pQVar6,&this->text,0x104f0c);
        }
        else if (this->effectiveTextFormat == RichText) {
          QTextDocument::setHtml((QString *)pQVar6);
        }
        else {
          QTextDocument::setPlainText((QString *)pQVar6);
        }
        QTextDocument::setUndoRedoEnabled(SUB81(pQVar6,0));
        uVar5 = *(ushort *)&this->field_0x340;
        if ((uVar5 & 0x20) != 0) {
          local_74 = 0;
          _cursor = &DAT_aaaaaaaaaaaaaaaa;
          QTextCursor::QTextCursor(&cursor);
          bVar7 = false;
          while( true ) {
            pQVar6 = QWidgetTextControl::document((QWidgetTextControl *)this->control);
            latin1.m_data = "&";
            latin1.m_size = 1;
            QString::QString((QString *)&local_58,latin1);
            QTextDocument::find(&local_68,pQVar6,&local_58,local_74,0);
            puVar2 = _cursor;
            _cursor = (undefined1 *)local_68.m_size;
            local_68.m_size = (qsizetype)puVar2;
            cVar3 = QTextCursor::isNull();
            QTextCursor::~QTextCursor((QTextCursor *)&local_68);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
            if (cVar3 != '\0') break;
            QTextCursor::deleteChar();
            QTextCursor::movePosition((MoveOperation)&cursor,0x11,1);
            local_74 = QTextCursor::position();
            if (bVar7) {
              bVar7 = true;
            }
            else {
              QTextCursor::selectedText();
              local_68.m_size = 1;
              local_68.m_data = "&";
              bVar4 = ::operator!=((QString *)&local_58,&local_68);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
              bVar7 = false;
              if (bVar4) {
                QTextCursor::operator=(&this->shortcutCursor,&cursor);
                bVar7 = true;
              }
            }
          }
          QTextCursor::~QTextCursor(&cursor);
          uVar5 = *(ushort *)&this->field_0x340;
        }
      }
    }
    *(ushort *)&this->field_0x340 = uVar5 & 0xfff7;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLabelPrivate::ensureTextPopulated() const
{
    if (!textDirty)
        return;
    if (control) {
        QTextDocument *doc = control->document();
        if (textDirty) {
            if (effectiveTextFormat == Qt::PlainText) {
                doc->setPlainText(text);
#if QT_CONFIG(texthtmlparser)
            } else if (effectiveTextFormat == Qt::RichText) {
                doc->setHtml(text);
#endif
#if QT_CONFIG(textmarkdownreader)
            } else if (effectiveTextFormat == Qt::MarkdownText) {
                doc->setMarkdown(text);
#endif
            } else {
                doc->setPlainText(text);
            }
            doc->setUndoRedoEnabled(false);

#ifndef QT_NO_SHORTCUT
            if (hasShortcut) {
                // Underline the first character that follows an ampersand (and remove the others ampersands)
                int from = 0;
                bool found = false;
                QTextCursor cursor;
                while (!(cursor = control->document()->find(("&"_L1), from)).isNull()) {
                    cursor.deleteChar(); // remove the ampersand
                    cursor.movePosition(QTextCursor::NextCharacter, QTextCursor::KeepAnchor);
                    from = cursor.position();
                    if (!found && cursor.selectedText() != "&"_L1) { //not a second &
                        found = true;
                        shortcutCursor = cursor;
                    }
                }
            }
#endif
        }
    }
    textDirty = false;
}